

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimum.cpp
# Opt level: O3

void __thiscall Minimum<1>::Minimum(Minimum<1> *this,vec<IntView<1>_> *_x,IntView<1> _y)

{
  IntView<1> *pIVar1;
  long *plVar2;
  IntVar *pIVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Minimum<1> *local_38;
  
  pIVar3 = _y.var;
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_38 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_38);
  local_38 = (Minimum<1> *)&this->super_Checker;
  (this->super_Checker)._vptr_Checker = (_func_int **)&PTR___cxa_pure_virtual_0020c340;
  vec<Checker_*>::push(&engine.checkers,(Checker **)&local_38);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020c358;
  (this->super_Checker)._vptr_Checker = (_func_int **)&DAT_0020c3c0;
  this->sz = _x->sz;
  pIVar1 = _x->data;
  _x->sz = 0;
  _x->cap = 0;
  _x->data = (IntView<1> *)0x0;
  this->x = pIVar1;
  (this->y).var = pIVar3;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->min_max_var).v = -1;
  (this->min_max).v = 0x7fffffff;
  (this->min_fixed).v = 0x7fffffff;
  this->lower_change = false;
  (this->super_Propagator).priority = 1;
  uVar4 = (ulong)(uint)this->sz;
  if (0 < this->sz) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      plVar2 = *(long **)((long)&this->x->var + lVar6);
      (**(code **)(*plVar2 + 0x38))(plVar2,this,uVar5 & 0xffffffff,6);
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)this->sz;
      lVar6 = lVar6 + 0x10;
    } while ((long)uVar5 < (long)uVar4);
    pIVar3 = (this->y).var;
  }
  (*(pIVar3->super_Var).super_Branching._vptr_Branching[7])(pIVar3,this,uVar4,4);
  return;
}

Assistant:

Minimum(vec<IntView<U> > _x, IntView<U> _y)
			: sz(_x.size()),
				x(_x.release()),
				y(_y),
				min_max_var(-1),
				min_max(INT_MAX),
				min_fixed(INT_MAX) {
		priority = 1;
		for (int i = 0; i < sz; i++) {
			x[i].attach(this, i, EVENT_LU);
		}
		y.attach(this, sz, EVENT_L);
	}